

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall Population::process(Population *this)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  vector<Chromosome,_std::allocator<Chromosome>_> *this_00;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 local_48 [16];
  Chromosome *local_38;
  Chromosome *chromo;
  iterator __end1;
  iterator __begin1;
  vector<Chromosome,_std::allocator<Chromosome>_> *__range1;
  double totalFitness;
  Population *this_local;
  
  __range1 = (vector<Chromosome,_std::allocator<Chromosome>_> *)0x0;
  __end1 = std::vector<Chromosome,_std::allocator<Chromosome>_>::begin(&this->chromosomes);
  chromo = (Chromosome *)
           std::vector<Chromosome,_std::allocator<Chromosome>_>::end(&this->chromosomes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                                *)&chromo);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
               ::operator*(&__end1);
    Chromosome::process(local_38);
    dVar4 = Chromosome::getFitness(local_38);
    __range1 = (vector<Chromosome,_std::allocator<Chromosome>_> *)(dVar4 + (double)__range1);
    __gnu_cxx::
    __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>::
    operator++(&__end1);
  }
  this_00 = &this->chromosomes;
  std::vector<Chromosome,_std::allocator<Chromosome>_>::rbegin
            ((vector<Chromosome,_std::allocator<Chromosome>_> *)(local_48 + 8));
  std::vector<Chromosome,_std::allocator<Chromosome>_>::rend
            ((vector<Chromosome,_std::allocator<Chromosome>_> *)local_48);
  std::
  sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>_>
              *)(local_48 + 8),
             (reverse_iterator<__gnu_cxx::__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>_>
              *)local_48);
  pvVar2 = std::vector<Chromosome,_std::allocator<Chromosome>_>::back(this_00);
  dVar4 = Chromosome::getFitness(pvVar2);
  this->minFitness = dVar4;
  pvVar2 = std::vector<Chromosome,_std::allocator<Chromosome>_>::front(this_00);
  dVar4 = Chromosome::getFitness(pvVar2);
  this->maxFitness = dVar4;
  sVar3 = std::vector<Chromosome,_std::allocator<Chromosome>_>::size(this_00);
  auVar5._8_4_ = (int)(sVar3 >> 0x20);
  auVar5._0_8_ = sVar3;
  auVar5._12_4_ = 0x45300000;
  this->averageFitness =
       (double)__range1 /
       ((auVar5._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
  return;
}

Assistant:

void Population::process() {

    double totalFitness = 0;
    // re-calculate changed chromosomes
    for (Chromosome& chromo : chromosomes){
        chromo.process();
        totalFitness += chromo.getFitness();
    }
    // sort list by fitness
    std::sort(chromosomes.rbegin(), chromosomes.rend());
    // calculate min/max fitness of population

    minFitness = chromosomes.back().getFitness();
    maxFitness = chromosomes.front().getFitness();
    averageFitness = totalFitness/chromosomes.size();
}